

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O1

object * newObj(int cl)

{
  object *poVar1;
  long lVar2;
  object *poVar3;
  int iVar4;
  object *poVar5;
  ulong uVar6;
  size_t __n;
  ulong uVar7;
  
  poVar3 = guard;
  poVar1 = topScope;
  uVar6 = 0xffffffffffffffff;
  do {
    lVar2 = uVar6 + 1;
    uVar6 = uVar6 + 1;
  } while (idName[lVar2] != '\0');
  if (uVar6 == 0) {
    uVar6 = 0;
  }
  else {
    uVar7 = 1;
    if (1 < (int)uVar6) {
      uVar7 = uVar6 & 0xffffffff;
    }
    uVar6 = 0;
    do {
      poVar3->name[uVar6] = idName[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar7 != uVar6);
  }
  poVar3->name[uVar6] = '\0';
  iVar4 = stringCompare(idName,poVar1->next->name);
  poVar3 = guard;
  while (guard = poVar3, iVar4 != 0) {
    poVar1 = poVar1->next;
    iVar4 = stringCompare(idName,poVar1->next->name);
    poVar3 = guard;
  }
  if (poVar1->next == poVar3) {
    poVar5 = (object *)calloc(1,0x90);
    poVar5->cl = cl;
    poVar5->next = poVar3;
    poVar1->next = poVar5;
    uVar6 = 0xffffffffffffffff;
    do {
      lVar2 = uVar6 + 1;
      uVar6 = uVar6 + 1;
    } while (idName[lVar2] != '\0');
    if (uVar6 == 0) {
      __n = 0;
    }
    else {
      __n = 1;
      if (1 < (int)uVar6) {
        __n = uVar6 & 0xffffffff;
      }
      memcpy(poVar5->name,idName,__n);
    }
    poVar5->name[__n] = '\0';
    return poVar5;
  }
  mark("multiple definition");
  exit(-1);
}

Assistant:

object *newObj(int cl) {
	variable int ret;
	variable struct object *newObject; variable struct object *x;
	ret = 0; x = topScope;
	stringCopy(idName,guard->name);
	ret = stringCompare(idName,x->next->name);
	while (ret != 0) {
		x = x->next;
		ret = stringCompare(idName,x->next->name);
	}
	if (x->next == guard) {
		allocMem(newObject);
		newObject->cl = cl;	newObject->next = guard; x->next = newObject;
		stringCopy(idName,newObject->name);	
		return newObject;
	} else {
		mark("multiple definition");
		exit(-1);
	}
}